

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O3

bool isPrimeMillerRabin(BN *n,size_t k)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_t shift;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  bool bVar8;
  BN n1;
  BN a;
  BN t;
  BN x;
  BN local_c0;
  BN local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  bVar1 = BN::isEven(n);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BN::BN(&local_a8,n);
    BN::operator--(&local_a8);
    shift = BN::countzeroright(&local_a8);
    BN::operator>>(&local_78,&local_a8,shift);
    if (k == 0) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
      uVar5 = 0;
      do {
        BN::BN(&local_90,uVar5 + 2);
        BN::PowMod(&local_48,&local_90,&local_78,n);
        BN::bn1();
        bVar2 = BN::operator==(&local_48,&local_c0);
        if (bVar2) {
          if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = 0;
        }
        else {
          bVar2 = BN::operator==(&local_48,&local_a8);
          if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (shift == 1 || bVar2) {
            bVar6 = bVar2 * '\x03' + 1;
          }
          else {
            uVar7 = 1;
            while( true ) {
              BN::Qrt(&local_60,&local_48);
              BN::operator%(&local_c0,&local_60,n);
              BN::operator=(&local_48,&local_c0);
              if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              BN::bn1();
              bVar2 = BN::operator==(&local_48,&local_c0);
              if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (bVar2) break;
              bVar3 = BN::operator==(&local_48,&local_a8);
              bVar4 = 5;
              if ((bVar3) || (bVar8 = shift - 1 <= uVar7, uVar7 = uVar7 + 1, bVar8))
              goto LAB_0010cc97;
            }
            bVar4 = 1;
            bVar3 = false;
LAB_0010cc97:
            bVar6 = bVar3 ^ 1;
            if (bVar2) {
              bVar6 = bVar4;
            }
          }
        }
        if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((bVar6 & 3) != 0) break;
        uVar5 = uVar5 + 1;
        bVar1 = k <= uVar5;
      } while (uVar5 != k);
    }
    if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool isPrimeMillerRabin(const BN& n, size_t k) {
    if (n.isEven()) {
        return false;
    }
    BN n1(n);
    --n1;
    size_t s = n1.countzeroright();
    BN t = n1 >> s;
    for (size_t i = 0; i < k; ++i) {
        BN a(uint64_t(i + 2));
        BN x = a.PowMod(t, n);
        if (x == BN::bn1() || x == n1)
            continue;
        bool stop = false;
        for (size_t j = 0; !stop && j < s - 1; ++j) {
            x = x.Qrt() % n;
            if (x == BN::bn1())
                return false;
            if (x == n1)
                stop = true;
        }
        if (!stop)
            return false;
    }
    return true;
}